

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double pareto_pdf(double x,double a,double b)

{
  double dVar1;
  double dVar2;
  
  dVar1 = 0.0;
  if (a <= x) {
    dVar2 = pow(a,b);
    dVar1 = pow(x,b + 1.0);
    dVar1 = (dVar2 * b) / dVar1;
  }
  return dVar1;
}

Assistant:

double pareto_pdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    PARETO_PDF evaluates the Pareto PDF.
//
//  Discussion:
//
//    PDF(A,B;X) = B * A^B / X^(B+1).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    A <= X
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A.
//    0.0 < B.
//
//    Output, double PARETO_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < a )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = b * pow ( a, b ) / pow ( x, ( b + 1.0 ) );
  }

  return pdf;
}